

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

MppBufferGroup dec_buf_mgr_setup(DecBufMgr mgr,RK_U32 size,RK_U32 count,MppDecBufMode mode)

{
  long *plVar1;
  long lVar2;
  uint uVar3;
  MppDecBufMode MVar4;
  int iVar5;
  long lVar6;
  MppBufferGroup pvVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  MppBufferInfo commit;
  undefined4 local_58 [2];
  ulong local_50;
  undefined8 local_48;
  undefined4 local_38;
  int local_34;
  
  if (mgr == (DecBufMgr)0x0) {
LAB_00107343:
    pvVar7 = (MppBufferGroup)0x0;
  }
  else {
    plVar1 = (long *)((long)mgr + 0x10);
    if (*(long *)((long)mgr + 0x10) != 0) {
      if (*mgr == mode) {
        mpp_buffer_group_clear();
      }
      else {
        mpp_buffer_group_put();
        *plVar1 = 0;
      }
      if (*(long *)((long)mgr + 0x18) != 0) {
        uVar3 = *(uint *)((long)mgr + 4);
        if (uVar3 == 0) {
LAB_00107047:
          mpp_osal_free("dec_buf_mgr_setup");
        }
        else {
          uVar10 = 0;
          do {
            lVar6 = *(long *)(*(long *)((long)mgr + 0x18) + uVar10 * 8);
            if (lVar6 != 0) {
              mpp_buffer_put_with_caller(lVar6,"dec_buf_mgr_setup");
              *(undefined8 *)(*(long *)((long)mgr + 0x18) + uVar10 * 8) = 0;
              uVar3 = *(uint *)((long)mgr + 4);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar3);
          if (*(long *)((long)mgr + 0x18) != 0) goto LAB_00107047;
        }
        *(undefined8 *)((long)mgr + 0x18) = 0;
      }
    }
    if (mode == MPP_DEC_BUF_EXTERNAL) {
      lVar6 = mpp_osal_calloc("dec_buf_mgr_setup");
      *(long *)((long)mgr + 0x18) = lVar6;
      if (lVar6 == 0) {
        pcVar8 = "create %d external buffer record failed\n";
        MVar4 = count;
        goto LAB_00107334;
      }
      iVar5 = -1;
      if (*plVar1 == 0) {
        MVar4 = mpp_buffer_group_get(plVar1,1,1,"mpi_dec_utils","dec_buf_mgr_setup");
        if (MVar4 != MPP_DEC_BUF_HALF_INT) {
          pcVar8 = "get mpp external buffer group failed ret %d\n";
          goto LAB_00107334;
        }
        iVar5 = 0;
      }
      local_58[0] = 1;
      uVar10 = (ulong)size;
      local_50 = uVar10;
      if (count == 0) {
LAB_001072f8:
        if (iVar5 != 0) goto LAB_0010733b;
      }
      else {
        lVar6 = 0;
        iVar9 = 0;
        do {
          iVar5 = mpp_buffer_get_with_tag
                            (0,*(long *)((long)mgr + 0x18) + lVar6,uVar10,"mpi_dec_utils",
                             "dec_buf_mgr_setup");
          if ((iVar5 != 0) || (lVar2 = *(long *)(*(long *)((long)mgr + 0x18) + lVar6), lVar2 == 0))
          {
            _mpp_log_l(2,"mpi_dec_utils","get misc buffer failed ret %d\n","dec_buf_mgr_setup",iVar5
                      );
            goto LAB_001072f8;
          }
          local_34 = iVar9;
          local_48 = mpp_buffer_get_ptr_with_caller(lVar2,"dec_buf_mgr_setup");
          local_38 = mpp_buffer_get_fd_with_caller
                               (*(undefined8 *)(*(long *)((long)mgr + 0x18) + lVar6),
                                "dec_buf_mgr_setup");
          MVar4 = mpp_buffer_import_with_tag
                            (*(undefined8 *)((long)mgr + 0x10),local_58,0,"mpi_dec_utils",
                             "dec_buf_mgr_setup");
          if (MVar4 != MPP_DEC_BUF_HALF_INT) {
            pcVar8 = "external buffer commit failed ret %d\n";
            goto LAB_00107334;
          }
          iVar9 = iVar9 + 1;
          lVar6 = lVar6 + 8;
        } while ((ulong)count << 3 != lVar6);
      }
    }
    else {
      if (mode != MPP_DEC_BUF_INTERNAL) {
        if (mode == MPP_DEC_BUF_HALF_INT) {
          lVar6 = *plVar1;
          if (lVar6 == 0) {
            MVar4 = mpp_buffer_group_get(plVar1,1,0,"mpi_dec_utils","dec_buf_mgr_setup");
            if (MVar4 != MPP_DEC_BUF_HALF_INT) {
              pcVar8 = "get mpp internal buffer group failed ret %d\n";
              goto LAB_00107334;
            }
            lVar6 = *plVar1;
          }
          MVar4 = mpp_buffer_group_limit_config(lVar6,size,count);
          if (MVar4 == MPP_DEC_BUF_HALF_INT) goto LAB_001070e9;
          pcVar8 = "limit buffer group failed ret %d\n";
        }
        else {
          pcVar8 = "unsupport buffer mode %d\n";
          MVar4 = mode;
        }
LAB_00107334:
        _mpp_log_l(2,"mpi_dec_utils",pcVar8,"dec_buf_mgr_setup",MVar4);
LAB_0010733b:
        dec_buf_mgr_deinit(mgr);
        goto LAB_00107343;
      }
      if ((*plVar1 != 0) &&
         (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,
                     "((void*)0) == impl->group","dec_buf_mgr_setup",0x365),
         (DAT_001142e3 & 0x10) != 0)) {
        abort();
      }
    }
LAB_001070e9:
    *(RK_U32 *)((long)mgr + 4) = count;
    *(RK_U32 *)((long)mgr + 8) = size;
    *(MppDecBufMode *)mgr = mode;
    pvVar7 = *(MppBufferGroup *)((long)mgr + 0x10);
  }
  return pvVar7;
}

Assistant:

MppBufferGroup dec_buf_mgr_setup(DecBufMgr mgr, RK_U32 size, RK_U32 count, MppDecBufMode mode)
{
    DecBufMgrImpl *impl = (DecBufMgrImpl *)mgr;
    MPP_RET ret = MPP_NOK;

    if (!impl)
        return NULL;

    /* cleanup old buffers if previous buffer group exists */
    if (impl->group) {
        if (mode != impl->buf_mode) {
            /* switch to different buffer mode just release old buffer group */
            mpp_buffer_group_put(impl->group);
            impl->group = NULL;
        } else {
            /* otherwise just cleanup old buffers */
            mpp_buffer_group_clear(impl->group);
        }

        /* if there are external mode old buffers do cleanup */
        if (impl->bufs) {
            RK_U32 i;

            for (i = 0; i < impl->buf_count; i++) {
                if (impl->bufs[i]) {
                    mpp_buffer_put(impl->bufs[i]);
                    impl->bufs[i] = NULL;
                }
            }

            MPP_FREE(impl->bufs);
        }
    }

    switch (mode) {
    case MPP_DEC_BUF_HALF_INT : {
        /* reuse previous half internal buffer group and just reconfig limit */
        if (NULL == impl->group) {
            ret = mpp_buffer_group_get_internal(&impl->group, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err_f("get mpp internal buffer group failed ret %d\n", ret);
                break;
            }
        }
        /* Use limit config to limit buffer count and buffer size */
        ret = mpp_buffer_group_limit_config(impl->group, size, count);
        if (ret) {
            mpp_err_f("limit buffer group failed ret %d\n", ret);
        }
    } break;
    case MPP_DEC_BUF_INTERNAL : {
        /* do nothing juse keep buffer group empty */
        mpp_assert(NULL == impl->group);
        ret = MPP_OK;
    } break;
    case MPP_DEC_BUF_EXTERNAL : {
        RK_U32 i;
        MppBufferInfo commit;

        impl->bufs = mpp_calloc(MppBuffer, count);
        if (!impl->bufs) {
            mpp_err_f("create %d external buffer record failed\n", count);
            break;
        }

        /* reuse previous external buffer group */
        if (NULL == impl->group) {
            ret = mpp_buffer_group_get_external(&impl->group, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err_f("get mpp external buffer group failed ret %d\n", ret);
                break;
            }
        }

        /*
         * NOTE: Use default misc allocater here as external allocator for demo.
         * But in practical case the external buffer could be GraphicBuffer or gst dmabuf.
         * The misc allocator will cause the print at the end like:
         * ~MppBufferService cleaning misc group
         */
        commit.type = MPP_BUFFER_TYPE_ION;
        commit.size = size;

        for (i = 0; i < count; i++) {
            ret = mpp_buffer_get(NULL, &impl->bufs[i], size);
            if (ret || NULL == impl->bufs[i]) {
                mpp_err_f("get misc buffer failed ret %d\n", ret);
                break;
            }

            commit.index = i;
            commit.ptr = mpp_buffer_get_ptr(impl->bufs[i]);
            commit.fd = mpp_buffer_get_fd(impl->bufs[i]);

            ret = mpp_buffer_commit(impl->group, &commit);
            if (ret) {
                mpp_err_f("external buffer commit failed ret %d\n", ret);
                break;
            }
        }
    } break;
    default : {
        mpp_err_f("unsupport buffer mode %d\n", mode);
    } break;
    }

    if (ret) {
        dec_buf_mgr_deinit(impl);
        impl = NULL;
    } else {
        impl->buf_count = count;
        impl->buf_size = size;
        impl->buf_mode = mode;
    }

    return impl ? impl->group : NULL;
}